

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

void __thiscall doctest::detail::ContextState::ContextState(ContextState *this)

{
  _Rb_tree_header *p_Var1;
  vector<doctest::String,_std::allocator<doctest::String>_> *__cur;
  pointer __s;
  
  (this->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x90);
  (this->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  (this->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = __s;
  (this->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __s + 6;
  memset(__s,0,0x90);
  (this->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = __s + 6;
  String::String(&this->order_by,"");
  p_Var1 = &(this->subcasesPassed)._M_t._M_impl.super__Rb_tree_header;
  (this->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->subcasesEnteredLevels)._M_t._M_impl.super__Rb_tree_header;
  (this->subcasesEnteredLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subcasesEnteredLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->subcasesEnteredLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->subcasesEnteredLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->numAssertions = 0;
  this->numFailedAssertions = 0;
  (this->subcasesEnteredLevels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->subcasesStack).
  super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subcasesStack).
  super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subcasesStack).
  super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ContextState()
                : filters(6) // 6 different filters total
        {
            resetRunData();
        }